

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  *prVar1;
  FieldDescriptor *pFVar2;
  Reflection *pRVar3;
  bool bVar4;
  bool bVar5;
  CppType CVar6;
  int32_t iVar7;
  int32_t iVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  int iVar11;
  int64_t iVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  Token *pTVar15;
  int64_t iVar16;
  EnumDescriptor *pEVar17;
  EnumValueDescriptor *pEVar18;
  EnumValueDescriptor *pEVar19;
  LogMessage *pLVar20;
  uint *puVar21;
  AlphaNum *b;
  AlphaNum *a;
  float fVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  bool local_a51;
  bool local_941;
  LogMessage local_868;
  Voidify local_851;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
  local_850;
  Id local_838;
  AlphaNum local_828;
  string_view local_7f8;
  AlphaNum local_7e8;
  AlphaNum local_7b8;
  AlphaNum local_788;
  AlphaNum local_758;
  string local_728;
  string_view local_708;
  AlphaNum local_6f8;
  string_view local_6c8;
  AlphaNum local_6b8;
  AlphaNum local_688;
  AlphaNum local_658;
  AlphaNum local_628;
  string local_5f8;
  string_view local_5d8;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
  local_5c8;
  Id local_5b0;
  AlphaNum local_5a0;
  AlphaNum local_570;
  string local_540;
  string_view local_520;
  AlphaNum local_510;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  string_view local_498;
  EnumValueDescriptor *local_488;
  EnumValueDescriptor *enum_value;
  EnumDescriptor *enum_type;
  int64_t int_value;
  string value_9;
  AlphaNum local_420;
  AlphaNum local_3f0;
  string_view local_3c0;
  AlphaNum local_3b0;
  AlphaNum local_380;
  string local_350;
  string_view local_330;
  undefined1 local_319;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
  local_318;
  Id local_300;
  undefined1 local_2e9;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
  local_2e8;
  Id local_2d0;
  undefined1 local_2c0 [8];
  string value_8;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
  local_298;
  Id local_280;
  uint64_t local_270;
  uint64_t value_7;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
  local_248;
  Id local_230;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_220;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  byte local_1f9;
  string local_1f8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1d8;
  string_view local_1c8;
  string local_1b8;
  int local_198;
  undefined1 local_188 [8];
  string value_6;
  Id local_150;
  double local_140;
  double value_5;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
  local_130;
  Id local_118;
  double local_108;
  double value_4;
  Id local_e8;
  uint64_t local_d8;
  uint64_t value_3;
  Id local_b8;
  int64_t local_a8;
  int64_t value_2;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
  local_98;
  Id local_80;
  uint32_t local_70 [2];
  uint64_t value_1;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
  local_60;
  Id local_48;
  int32_t local_38 [2];
  int64_t value;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  ParserImpl *this_local;
  
  value = (int64_t)field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  CVar6 = FieldDescriptor::cpp_type(field);
  puVar21 = &switchD_00593ec8::switchdataD_0082d4fc;
  switch(CVar6) {
  case CPPTYPE_INT32:
    bVar4 = ConsumeSignedInteger(this,(int64_t *)local_38,0x7fffffff);
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00595b75;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    if (bVar4) {
      Reflection::AddInt32
                ((Reflection *)field_local,(Message *)reflection_local,(FieldDescriptor *)value,
                 local_38[0]);
    }
    else {
      if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
         (bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value), !bVar4)) {
        iVar7 = FieldDescriptor::default_value_int32((FieldDescriptor *)value);
        iVar8 = Reflection::GetInt32
                          ((Reflection *)field_local,(Message *)reflection_local,
                           (FieldDescriptor *)value);
        if ((iVar7 == iVar8) &&
           (iVar7 = FieldDescriptor::default_value_int32((FieldDescriptor *)value),
           iVar7 == local_38[0])) {
          prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                    *)this->no_op_fields_;
          local_48 = UnsetFieldsMetadata::GetUnsetFieldId
                               ((Message *)reflection_local,(FieldDescriptor *)value);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::insert(&local_60,prVar1,&local_48);
          break;
        }
      }
      Reflection::SetInt32
                ((Reflection *)field_local,(Message *)reflection_local,(FieldDescriptor *)value,
                 local_38[0]);
    }
    break;
  case CPPTYPE_INT64:
    bVar4 = ConsumeSignedInteger(this,&local_a8,0x7fffffffffffffff);
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00595b75;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    if (bVar4) {
      Reflection::AddInt64
                ((Reflection *)field_local,(Message *)reflection_local,(FieldDescriptor *)value,
                 local_a8);
    }
    else {
      if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
         (bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value), !bVar4)) {
        iVar16 = FieldDescriptor::default_value_int64((FieldDescriptor *)value);
        iVar12 = Reflection::GetInt64
                           ((Reflection *)field_local,(Message *)reflection_local,
                            (FieldDescriptor *)value);
        if ((iVar16 == iVar12) &&
           (iVar16 = FieldDescriptor::default_value_int64((FieldDescriptor *)value),
           iVar16 == local_a8)) {
          prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                    *)this->no_op_fields_;
          local_b8 = UnsetFieldsMetadata::GetUnsetFieldId
                               ((Message *)reflection_local,(FieldDescriptor *)value);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::insert((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                    *)&value_3,prVar1,&local_b8);
          break;
        }
      }
      Reflection::SetInt64
                ((Reflection *)field_local,(Message *)reflection_local,(FieldDescriptor *)value,
                 local_a8);
    }
    break;
  case CPPTYPE_UINT32:
    bVar4 = ConsumeUnsignedInteger(this,(uint64_t *)local_70,0xffffffff);
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00595b75;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    if (bVar4) {
      Reflection::AddUInt32
                ((Reflection *)field_local,(Message *)reflection_local,(FieldDescriptor *)value,
                 local_70[0]);
    }
    else {
      if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
         (bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value), !bVar4)) {
        uVar9 = FieldDescriptor::default_value_uint32((FieldDescriptor *)value);
        uVar10 = Reflection::GetUInt32
                           ((Reflection *)field_local,(Message *)reflection_local,
                            (FieldDescriptor *)value);
        if ((uVar9 == uVar10) &&
           (uVar9 = FieldDescriptor::default_value_uint32((FieldDescriptor *)value),
           uVar9 == local_70[0])) {
          prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                    *)this->no_op_fields_;
          local_80 = UnsetFieldsMetadata::GetUnsetFieldId
                               ((Message *)reflection_local,(FieldDescriptor *)value);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::insert(&local_98,prVar1,&local_80);
          break;
        }
      }
      Reflection::SetUInt32
                ((Reflection *)field_local,(Message *)reflection_local,(FieldDescriptor *)value,
                 local_70[0]);
    }
    break;
  case CPPTYPE_UINT64:
    bVar4 = ConsumeUnsignedInteger(this,&local_d8,0xffffffffffffffff);
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00595b75;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    if (bVar4) {
      Reflection::AddUInt64
                ((Reflection *)field_local,(Message *)reflection_local,(FieldDescriptor *)value,
                 local_d8);
    }
    else {
      if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
         (bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value), !bVar4)) {
        uVar13 = FieldDescriptor::default_value_uint64((FieldDescriptor *)value);
        uVar14 = Reflection::GetUInt64
                           ((Reflection *)field_local,(Message *)reflection_local,
                            (FieldDescriptor *)value);
        if ((uVar13 == uVar14) &&
           (uVar13 = FieldDescriptor::default_value_uint64((FieldDescriptor *)value),
           uVar13 == local_d8)) {
          prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                    *)this->no_op_fields_;
          local_e8 = UnsetFieldsMetadata::GetUnsetFieldId
                               ((Message *)reflection_local,(FieldDescriptor *)value);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::insert((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                    *)&value_4,prVar1,&local_e8);
          break;
        }
      }
      Reflection::SetUInt64
                ((Reflection *)field_local,(Message *)reflection_local,(FieldDescriptor *)value,
                 local_d8);
    }
    break;
  case CPPTYPE_DOUBLE:
    bVar4 = ConsumeDouble(this,&local_140);
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00595b75;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    if (bVar4) {
      Reflection::AddDouble
                ((Reflection *)field_local,(Message *)reflection_local,(FieldDescriptor *)value,
                 local_140);
    }
    else {
      if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
         (bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value), !bVar4)) {
        dVar24 = FieldDescriptor::default_value_double((FieldDescriptor *)value);
        dVar25 = Reflection::GetDouble
                           ((Reflection *)field_local,(Message *)reflection_local,
                            (FieldDescriptor *)value);
        if ((dVar24 == dVar25) && (!NAN(dVar24) && !NAN(dVar25))) {
          dVar24 = FieldDescriptor::default_value_double((FieldDescriptor *)value);
          if ((dVar24 == local_140) && (!NAN(dVar24) && !NAN(local_140))) {
            prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                      *)this->no_op_fields_;
            local_150 = UnsetFieldsMetadata::GetUnsetFieldId
                                  ((Message *)reflection_local,(FieldDescriptor *)value);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::insert((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                      *)((long)&value_6.field_2 + 8),prVar1,&local_150);
            break;
          }
        }
      }
      Reflection::SetDouble
                ((Reflection *)field_local,(Message *)reflection_local,(FieldDescriptor *)value,
                 local_140);
    }
    break;
  case CPPTYPE_FLOAT:
    bVar4 = ConsumeDouble(this,&local_108);
    if (!bVar4) {
      this_local._7_1_ = 0;
      goto LAB_00595b75;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
    pRVar3 = reflection_local;
    pFVar2 = field_local;
    iVar16 = value;
    if (bVar4) {
      fVar22 = io::SafeDoubleToFloat(local_108);
      Reflection::AddFloat((Reflection *)pFVar2,(Message *)pRVar3,(FieldDescriptor *)iVar16,fVar22);
    }
    else {
      if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
         (bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value), !bVar4)) {
        fVar22 = FieldDescriptor::default_value_float((FieldDescriptor *)value);
        fVar23 = Reflection::GetFloat
                           ((Reflection *)field_local,(Message *)reflection_local,
                            (FieldDescriptor *)value);
        if ((fVar22 == fVar23) && (!NAN(fVar22) && !NAN(fVar23))) {
          fVar22 = FieldDescriptor::default_value_float((FieldDescriptor *)value);
          fVar23 = io::SafeDoubleToFloat(local_108);
          if ((fVar22 == fVar23) && (!NAN(fVar22) && !NAN(fVar23))) {
            prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                      *)this->no_op_fields_;
            local_118 = UnsetFieldsMetadata::GetUnsetFieldId
                                  ((Message *)reflection_local,(FieldDescriptor *)value);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::insert(&local_130,prVar1,&local_118);
            break;
          }
        }
      }
      pRVar3 = reflection_local;
      pFVar2 = field_local;
      iVar16 = value;
      value_5._4_4_ = io::SafeDoubleToFloat(local_108);
      Reflection::SetFloat
                ((Reflection *)pFVar2,(Message *)pRVar3,(FieldDescriptor *)iVar16,value_5._4_4_);
    }
    break;
  case CPPTYPE_BOOL:
    bVar4 = LookingAtType(this,TYPE_INTEGER);
    if (bVar4) {
      bVar4 = ConsumeUnsignedInteger(this,&local_270,1);
      if (!bVar4) {
        this_local._7_1_ = 0;
        goto LAB_00595b75;
      }
      bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
      if (bVar4) {
        Reflection::AddBool((Reflection *)field_local,(Message *)reflection_local,
                            (FieldDescriptor *)value,local_270 != 0);
      }
      else {
        if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
           (bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value), !bVar4)) {
          bVar4 = FieldDescriptor::default_value_bool((FieldDescriptor *)value);
          bVar5 = Reflection::GetBool((Reflection *)field_local,(Message *)reflection_local,
                                      (FieldDescriptor *)value);
          if ((bVar4 == bVar5) &&
             (bVar4 = FieldDescriptor::default_value_bool((FieldDescriptor *)value),
             bVar4 == (local_270 != 0))) {
            prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                      *)this->no_op_fields_;
            local_280 = UnsetFieldsMetadata::GetUnsetFieldId
                                  ((Message *)reflection_local,(FieldDescriptor *)value);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::insert(&local_298,prVar1,&local_280);
            break;
          }
        }
        value_8.field_2._M_local_buf[0xf] = local_270 != 0;
        Reflection::SetBool((Reflection *)field_local,(Message *)reflection_local,
                            (FieldDescriptor *)value,(bool)value_8.field_2._M_local_buf[0xf]);
      }
    }
    else {
      std::__cxx11::string::string((string *)local_2c0);
      bVar4 = ConsumeIdentifier(this,(string *)local_2c0);
      if (bVar4) {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2c0,"true");
        if (((bVar4) ||
            (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_2c0,"True"), bVar4)) ||
           (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2c0,"t"), bVar4)) {
          bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
          if (bVar4) {
            Reflection::AddBool((Reflection *)field_local,(Message *)reflection_local,
                                (FieldDescriptor *)value,true);
          }
          else {
            if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
               (bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value), !bVar4)) {
              bVar4 = FieldDescriptor::default_value_bool((FieldDescriptor *)value);
              bVar5 = Reflection::GetBool((Reflection *)field_local,(Message *)reflection_local,
                                          (FieldDescriptor *)value);
              if ((bVar4 == bVar5) &&
                 (bVar4 = FieldDescriptor::default_value_bool((FieldDescriptor *)value), bVar4)) {
                prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                          *)this->no_op_fields_;
                local_2d0 = UnsetFieldsMetadata::GetUnsetFieldId
                                      ((Message *)reflection_local,(FieldDescriptor *)value);
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                ::insert(&local_2e8,prVar1,&local_2d0);
                goto LAB_00594df5;
              }
            }
            local_2e9 = 1;
            Reflection::SetBool((Reflection *)field_local,(Message *)reflection_local,
                                (FieldDescriptor *)value,true);
          }
LAB_00594df5:
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2c0,"false");
          if (((!bVar4) &&
              (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2c0,"False"), !bVar4)) &&
             (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_2c0,"f"), !bVar4)) {
            absl::lts_20250127::AlphaNum::AlphaNum(&local_380,"Invalid value for boolean field \"");
            local_3c0 = FieldDescriptor::name((FieldDescriptor *)value);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_3b0,local_3c0);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_3f0,"\". Value: \"");
            absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                      (&local_420,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2c0);
            absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)((long)&value_9.field_2 + 8),"\".");
            absl::lts_20250127::StrCat<>
                      (&local_350,&local_380,&local_3b0,&local_3f0,&local_420,
                       (AlphaNum *)((long)&value_9.field_2 + 8));
            local_330 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_350);
            ReportError(this,local_330);
            std::__cxx11::string::~string((string *)&local_350);
            this_local._7_1_ = 0;
            local_198 = 1;
            goto LAB_00595115;
          }
          bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
          if (bVar4) {
            Reflection::AddBool((Reflection *)field_local,(Message *)reflection_local,
                                (FieldDescriptor *)value,false);
          }
          else {
            if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
               (bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value), !bVar4)) {
              bVar4 = FieldDescriptor::default_value_bool((FieldDescriptor *)value);
              bVar5 = Reflection::GetBool((Reflection *)field_local,(Message *)reflection_local,
                                          (FieldDescriptor *)value);
              if ((bVar4 == bVar5) &&
                 (bVar4 = FieldDescriptor::default_value_bool((FieldDescriptor *)value), !bVar4)) {
                prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                          *)this->no_op_fields_;
                local_300 = UnsetFieldsMetadata::GetUnsetFieldId
                                      ((Message *)reflection_local,(FieldDescriptor *)value);
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                ::insert(&local_318,prVar1,&local_300);
                goto LAB_00594fbc;
              }
            }
            local_319 = 0;
            Reflection::SetBool((Reflection *)field_local,(Message *)reflection_local,
                                (FieldDescriptor *)value,false);
          }
LAB_00594fbc:
        }
        local_198 = 0;
      }
      else {
        this_local._7_1_ = 0;
        local_198 = 1;
      }
LAB_00595115:
      std::__cxx11::string::~string((string *)local_2c0);
      if (local_198 != 0) goto LAB_00595b75;
    }
    break;
  case CPPTYPE_ENUM:
    std::__cxx11::string::string((string *)&int_value);
    enum_type = (EnumDescriptor *)0x7fffffffffffffff;
    enum_value = (EnumValueDescriptor *)FieldDescriptor::enum_type((FieldDescriptor *)value);
    local_488 = (EnumValueDescriptor *)0x0;
    bVar4 = LookingAtType(this,TYPE_IDENTIFIER);
    if (bVar4) {
      bVar4 = ConsumeIdentifier(this,(string *)&int_value);
      pEVar18 = enum_value;
      if (bVar4) {
        local_498 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&int_value);
        local_488 = EnumDescriptor::FindValueByName((EnumDescriptor *)pEVar18,local_498);
LAB_005954e8:
        if (local_488 == (EnumValueDescriptor *)0x0) {
          if (enum_type != (EnumDescriptor *)0x7fffffffffffffff) {
            bVar4 = FieldDescriptor::legacy_enum_field_treated_as_closed((FieldDescriptor *)value);
            if (!bVar4) {
              bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
              if (bVar4) {
                Reflection::AddEnumValue
                          ((Reflection *)field_local,(Message *)reflection_local,
                           (FieldDescriptor *)value,(int)enum_type);
              }
              else {
                if (this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) {
                  bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value);
                  if (!bVar4) {
                    iVar16 = FieldDescriptor::default_value_int64((FieldDescriptor *)value);
                    iVar11 = Reflection::GetEnumValue
                                       ((Reflection *)field_local,(Message *)reflection_local,
                                        (FieldDescriptor *)value);
                    if (iVar16 == iVar11) {
                      pEVar17 = (EnumDescriptor *)
                                FieldDescriptor::default_value_int64((FieldDescriptor *)value);
                      if (pEVar17 == enum_type) {
                        prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                                  *)this->no_op_fields_;
                        local_5b0 = UnsetFieldsMetadata::GetUnsetFieldId
                                              ((Message *)reflection_local,(FieldDescriptor *)value)
                        ;
                        absl::lts_20250127::container_internal::
                        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                        ::insert(&local_5c8,prVar1,&local_5b0);
                        goto LAB_0059568e;
                      }
                    }
                  }
                }
                Reflection::SetEnumValue
                          ((Reflection *)field_local,(Message *)reflection_local,
                           (FieldDescriptor *)value,(int)enum_type);
              }
LAB_0059568e:
              this_local._7_1_ = 1;
              local_198 = 1;
              goto LAB_00595abc;
            }
          }
          if ((this->allow_unknown_enum_ & 1U) == 0) {
            absl::lts_20250127::AlphaNum::AlphaNum(&local_628,"Unknown enumeration value of \"");
            absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                      (&local_658,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &int_value);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_688,"\" for field \"");
            local_6c8 = FieldDescriptor::name((FieldDescriptor *)value);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_6b8,local_6c8);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_6f8,"\".");
            absl::lts_20250127::StrCat<>
                      (&local_5f8,&local_628,&local_658,&local_688,&local_6b8,&local_6f8);
            local_5d8 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_5f8);
            ReportError(this,local_5d8);
            std::__cxx11::string::~string((string *)&local_5f8);
            this_local._7_1_ = 0;
            local_198 = 1;
          }
          else {
            absl::lts_20250127::AlphaNum::AlphaNum(&local_758,"Unknown enumeration value of \"");
            absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                      (&local_788,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &int_value);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_7b8,"\" for field \"");
            local_7f8 = FieldDescriptor::name((FieldDescriptor *)value);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_7e8,local_7f8);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_828,"\".");
            absl::lts_20250127::StrCat<>
                      (&local_728,&local_758,&local_788,&local_7b8,&local_7e8,&local_828);
            local_708 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_728);
            ReportWarning(this,local_708);
            std::__cxx11::string::~string((string *)&local_728);
            this_local._7_1_ = 1;
            local_198 = 1;
          }
        }
        else {
          bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
          if (bVar4) {
            Reflection::AddEnum((Reflection *)field_local,(Message *)reflection_local,
                                (FieldDescriptor *)value,local_488);
          }
          else {
            if (this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) {
              bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value);
              if (!bVar4) {
                pEVar18 = FieldDescriptor::default_value_enum((FieldDescriptor *)value);
                pEVar19 = Reflection::GetEnum((Reflection *)field_local,(Message *)reflection_local,
                                              (FieldDescriptor *)value);
                if (pEVar18 == pEVar19) {
                  pEVar18 = FieldDescriptor::default_value_enum((FieldDescriptor *)value);
                  if (pEVar18 == local_488) {
                    prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                              *)this->no_op_fields_;
                    local_838 = UnsetFieldsMetadata::GetUnsetFieldId
                                          ((Message *)reflection_local,(FieldDescriptor *)value);
                    absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                    ::insert(&local_850,prVar1,&local_838);
                    goto LAB_00595ab2;
                  }
                }
              }
            }
            Reflection::SetEnum((Reflection *)field_local,(Message *)reflection_local,
                                (FieldDescriptor *)value,local_488);
          }
LAB_00595ab2:
          local_198 = 2;
        }
      }
      else {
        this_local._7_1_ = 0;
        local_198 = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"-",&local_4b9);
      bVar4 = LookingAt(this,&local_4b8);
      b = (AlphaNum *)CONCAT71((int7)((ulong)puVar21 >> 8),bVar4);
      local_a51 = true;
      if (!bVar4) {
        local_a51 = LookingAtType(this,TYPE_INTEGER);
      }
      std::__cxx11::string::~string((string *)&local_4b8);
      std::allocator<char>::~allocator(&local_4b9);
      if (local_a51 == false) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_570,"Expected integer or identifier, got: ");
        pTVar15 = io::Tokenizer::current(&this->tokenizer_);
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_5a0,&pTVar15->text);
        absl::lts_20250127::StrCat_abi_cxx11_(&local_540,(lts_20250127 *)&local_570,&local_5a0,b);
        local_520 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_540);
        ReportError(this,local_520);
        std::__cxx11::string::~string((string *)&local_540);
        this_local._7_1_ = 0;
        local_198 = 1;
      }
      else {
        bVar4 = ConsumeSignedInteger(this,(int64_t *)&enum_type,0x7fffffff);
        if (bVar4) {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_510,(long)enum_type);
          absl::lts_20250127::StrCat_abi_cxx11_(&local_4e0,(lts_20250127 *)&local_510,a);
          std::__cxx11::string::operator=((string *)&int_value,(string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_4e0);
          local_488 = EnumDescriptor::FindValueByNumber((EnumDescriptor *)enum_value,(int)enum_type)
          ;
          goto LAB_005954e8;
        }
        this_local._7_1_ = 0;
        local_198 = 1;
      }
    }
LAB_00595abc:
    std::__cxx11::string::~string((string *)&int_value);
    goto joined_r0x00594a31;
  case CPPTYPE_STRING:
    std::__cxx11::string::string((string *)local_188);
    bVar4 = ConsumeString(this,(string *)local_188);
    if (bVar4) {
      bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)value);
      pRVar3 = reflection_local;
      pFVar2 = field_local;
      iVar16 = value;
      if (bVar4) {
        std::__cxx11::string::string((string *)&local_1b8,(string *)local_188);
        Reflection::AddString
                  ((Reflection *)pFVar2,(Message *)pRVar3,(FieldDescriptor *)iVar16,&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      else {
        local_1f9 = 0;
        local_941 = false;
        if (this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) {
          bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)value);
          local_941 = false;
          if (!bVar4) {
            local_1c8 = FieldDescriptor::default_value_string((FieldDescriptor *)value);
            Reflection::GetString_abi_cxx11_
                      (&local_1f8,(Reflection *)field_local,(Message *)reflection_local,
                       (FieldDescriptor *)value);
            local_1f9 = 1;
            local_1d8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_1f8);
            bVar4 = std::operator==(local_1c8,local_1d8);
            local_941 = false;
            if (bVar4) {
              local_210 = FieldDescriptor::default_value_string((FieldDescriptor *)value);
              local_220 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_188);
              local_941 = std::operator==(local_210,local_220);
            }
          }
        }
        if ((local_1f9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1f8);
        }
        pRVar3 = reflection_local;
        pFVar2 = field_local;
        iVar16 = value;
        if (local_941 == false) {
          std::__cxx11::string::string((string *)&value_7,(string *)local_188);
          Reflection::SetString
                    ((Reflection *)pFVar2,(Message *)pRVar3,(FieldDescriptor *)iVar16,
                     (string *)&value_7);
          std::__cxx11::string::~string((string *)&value_7);
        }
        else {
          prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                    *)this->no_op_fields_;
          local_230 = UnsetFieldsMetadata::GetUnsetFieldId
                                ((Message *)reflection_local,(FieldDescriptor *)value);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::insert(&local_248,prVar1,&local_230);
        }
      }
      local_198 = 2;
    }
    else {
      this_local._7_1_ = 0;
      local_198 = 1;
    }
    std::__cxx11::string::~string((string *)local_188);
joined_r0x00594a31:
    if (local_198 == 1) goto LAB_00595b75;
    break;
  case CPPTYPE_MESSAGE:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_868,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x3aa);
    pLVar20 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_868);
    pLVar20 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        (pLVar20,(char (*) [45])"Reached an unintended state: CPPTYPE_MESSAGE");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_851,pLVar20);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_868);
  }
  this_local._7_1_ = 1;
LAB_00595b75:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message, const Reflection* reflection,
                         const FieldDescriptor* field) {
// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
// When checking for no-op operations, We verify that both the existing value in
// the message and the new value are the default. If the existing field value is
// not the default, setting it to the default should not be treated as a no-op.
// The pointer of this is kept in no_op_fields_ for bookkeeping.
#define SET_FIELD(CPPTYPE, CPPTYPELCASE, VALUE)                    \
  if (field->is_repeated()) {                                      \
    reflection->Add##CPPTYPE(message, field, VALUE);               \
  } else {                                                         \
    if (no_op_fields_ && !field->has_presence() &&                 \
        field->default_value_##CPPTYPELCASE() ==                   \
            reflection->Get##CPPTYPE(*message, field) &&           \
        field->default_value_##CPPTYPELCASE() == VALUE) {          \
      no_op_fields_->ids_.insert(                                  \
          UnsetFieldsMetadata::GetUnsetFieldId(*message, *field)); \
    } else {                                                       \
      reflection->Set##CPPTYPE(message, field, std::move(VALUE));  \
    }                                                              \
  }

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64_t value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, int32, static_cast<int32_t>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64_t value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, uint32, static_cast<uint32_t>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64_t value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64_t value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, uint64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        std::string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, string, std::move(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64_t value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, bool, static_cast<bool>(value));
        } else {
          std::string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, bool, false);
          } else {
            ReportError(absl::StrCat("Invalid value for boolean field \"",
                                     field->name(), "\". Value: \"", value,
                                     "\"."));
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        std::string value;
        int64_t int_value = kint64max;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = nullptr;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = absl::StrCat(int_value);  // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError(absl::StrCat("Expected integer or identifier, got: ",
                                   tokenizer_.current().text));
          return false;
        }

        if (enum_value == nullptr) {
          if (int_value != kint64max &&
              !field->legacy_enum_field_treated_as_closed()) {
            SET_FIELD(EnumValue, int64, int_value);
            return true;
          } else if (!allow_unknown_enum_) {
            ReportError(absl::StrCat("Unknown enumeration value of \"", value,
                                     "\" for field \"", field->name(), "\"."));
            return false;
          } else {
            ReportWarning(absl::StrCat("Unknown enumeration value of \"", value,
                                       "\" for field \"", field->name(),
                                       "\"."));
            return true;
          }
        }

        SET_FIELD(Enum, enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        ABSL_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }